

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b-ref.c
# Opt level: O3

void blake2b_compress(blake2b_state *S,uint8_t *block)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint64_t uVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  long in_FS_OFFSET;
  undefined8 local_b8;
  undefined8 uStack_b0;
  ulong local_a8;
  ulong uStack_a0;
  ulong local_98;
  ulong uStack_90;
  ulong local_88;
  ulong uStack_80;
  undefined8 local_78;
  undefined8 local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar29 = *(long *)block;
  lVar3 = *(long *)(block + 8);
  lVar4 = *(long *)(block + 0x10);
  lVar5 = *(long *)(block + 0x18);
  lVar6 = *(long *)(block + 0x20);
  lVar7 = *(long *)(block + 0x28);
  lVar8 = *(long *)(block + 0x30);
  lVar9 = *(long *)(block + 0x38);
  lVar10 = *(long *)(block + 0x40);
  lVar11 = *(long *)(block + 0x48);
  lVar12 = *(long *)(block + 0x50);
  lVar13 = *(long *)(block + 0x58);
  lVar14 = *(long *)(block + 0x60);
  lVar15 = *(long *)(block + 0x68);
  lVar16 = *(long *)(block + 0x70);
  lVar17 = *(long *)(block + 0x78);
  uVar27 = S->h[0] + S->h[4] + lVar29;
  uVar32 = uVar27 ^ S->t[0] ^ 0x510e527fade682d1;
  uVar28 = S->h[1] + S->h[5] + lVar4;
  uVar37 = uVar28 ^ S->t[1] ^ 0x9b05688c2b3e6c1f;
  uVar33 = uVar32 << 0x20 | uVar32 >> 0x20;
  local_78 = uVar33 + 0x6a09e667f3bcc908;
  uVar32 = S->h[4] ^ local_78;
  uVar32 = uVar32 << 0x28 | uVar32 >> 0x18;
  uVar40 = lVar3 + uVar27 + uVar32;
  uVar33 = uVar33 ^ uVar40;
  uVar34 = uVar33 << 0x30 | uVar33 >> 0x10;
  local_78 = local_78 + uVar34;
  uVar32 = uVar32 ^ local_78;
  uVar30 = uVar32 << 1 | (ulong)((long)uVar32 < 0);
  uVar27 = S->h[2] + S->h[6] + lVar6;
  uVar32 = uVar27 ^ S->f[0] ^ 0x1f83d9abfb41bd6b;
  uVar38 = uVar37 << 0x20 | uVar37 >> 0x20;
  local_70 = uVar38 + 0xbb67ae8584caa73b;
  uVar33 = S->h[5] ^ local_70;
  uVar37 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar33 = lVar5 + uVar28 + uVar37;
  uVar38 = uVar38 ^ uVar33;
  uVar39 = uVar38 << 0x30 | uVar38 >> 0x10;
  local_70 = local_70 + uVar39;
  uVar37 = uVar37 ^ local_70;
  uVar36 = uVar37 << 1 | (ulong)((long)uVar37 < 0);
  uVar28 = S->h[3] + S->h[7] + lVar8;
  uVar38 = uVar28 ^ S->f[1] ^ 0x5be0cd19137e2179;
  uVar32 = uVar32 << 0x20 | uVar32 >> 0x20;
  local_68 = uVar32 + 0x3c6ef372fe94f82b;
  uVar37 = S->h[6] ^ local_68;
  uVar37 = uVar37 << 0x28 | uVar37 >> 0x18;
  uVar35 = lVar7 + uVar27 + uVar37;
  uVar32 = uVar32 ^ uVar35;
  uVar27 = uVar32 << 0x30 | uVar32 >> 0x10;
  local_68 = local_68 + uVar27;
  uVar37 = uVar37 ^ local_68;
  uVar32 = uVar37 << 1 | (ulong)((long)uVar37 < 0);
  uVar31 = uVar38 << 0x20 | uVar38 >> 0x20;
  local_60 = uVar31 + 0xa54ff53a5f1d36f1;
  uVar37 = S->h[7] ^ local_60;
  uVar37 = uVar37 << 0x28 | uVar37 >> 0x18;
  uVar38 = lVar9 + uVar28 + uVar37;
  uVar31 = uVar31 ^ uVar38;
  uVar28 = uVar31 << 0x30 | uVar31 >> 0x10;
  local_60 = local_60 + uVar28;
  uVar37 = uVar37 ^ local_60;
  uVar37 = uVar37 << 1 | (ulong)((long)uVar37 < 0);
  uVar31 = uVar40 + lVar10 + uVar36;
  uVar28 = uVar28 ^ uVar31;
  uVar28 = uVar28 << 0x20 | uVar28 >> 0x20;
  local_68 = local_68 + uVar28;
  uVar36 = uVar36 ^ local_68;
  uVar36 = uVar36 << 0x28 | uVar36 >> 0x18;
  uVar40 = uVar31 + lVar11 + uVar36;
  uVar28 = uVar28 ^ uVar40;
  uVar31 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_68 = local_68 + uVar31;
  uVar36 = uVar36 ^ local_68;
  uVar36 = uVar36 << 1 | (ulong)((long)uVar36 < 0);
  uVar28 = uVar33 + lVar12 + uVar32;
  uVar34 = uVar34 ^ uVar28;
  uVar33 = uVar34 << 0x20 | uVar34 >> 0x20;
  local_60 = local_60 + uVar33;
  uVar32 = uVar32 ^ local_60;
  uVar32 = uVar32 << 0x28 | uVar32 >> 0x18;
  uVar28 = uVar28 + lVar13 + uVar32;
  uVar33 = uVar33 ^ uVar28;
  uVar34 = uVar33 << 0x30 | uVar33 >> 0x10;
  local_60 = local_60 + uVar34;
  uVar32 = uVar32 ^ local_60;
  uVar33 = uVar32 << 1 | (ulong)((long)uVar32 < 0);
  uVar35 = uVar35 + lVar14 + uVar37;
  uVar39 = uVar39 ^ uVar35;
  uVar39 = uVar39 << 0x20 | uVar39 >> 0x20;
  local_78 = local_78 + uVar39;
  uVar37 = uVar37 ^ local_78;
  uVar32 = uVar37 << 0x28 | uVar37 >> 0x18;
  uVar35 = uVar35 + lVar15 + uVar32;
  uVar39 = uVar39 ^ uVar35;
  uVar39 = uVar39 << 0x30 | uVar39 >> 0x10;
  local_78 = local_78 + uVar39;
  uVar32 = uVar32 ^ local_78;
  uVar37 = uVar32 << 1 | (ulong)((long)uVar32 < 0);
  uVar38 = uVar38 + lVar16 + uVar30;
  uVar27 = uVar27 ^ uVar38;
  uVar27 = uVar27 << 0x20 | uVar27 >> 0x20;
  local_70 = local_70 + uVar27;
  uVar30 = uVar30 ^ local_70;
  uVar32 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar30 = uVar38 + lVar17 + uVar32;
  uVar27 = uVar27 ^ uVar30;
  uVar27 = uVar27 << 0x30 | uVar27 >> 0x10;
  local_70 = local_70 + uVar27;
  uVar32 = uVar32 ^ local_70;
  uVar32 = uVar32 << 1 | (ulong)((long)uVar32 < 0);
  uVar40 = uVar40 + lVar16 + uVar32;
  uVar34 = uVar34 ^ uVar40;
  uVar38 = uVar34 << 0x20 | uVar34 >> 0x20;
  local_78 = local_78 + uVar38;
  uVar32 = uVar32 ^ local_78;
  uVar32 = uVar32 << 0x28 | uVar32 >> 0x18;
  uVar40 = uVar40 + lVar12 + uVar32;
  uVar38 = uVar38 ^ uVar40;
  uVar34 = uVar38 << 0x30 | uVar38 >> 0x10;
  local_78 = local_78 + uVar34;
  uVar32 = uVar32 ^ local_78;
  uVar32 = uVar32 << 1 | (ulong)((long)uVar32 < 0);
  uVar28 = uVar28 + lVar6 + uVar36;
  uVar39 = uVar39 ^ uVar28;
  uVar39 = uVar39 << 0x20 | uVar39 >> 0x20;
  local_70 = local_70 + uVar39;
  uVar36 = uVar36 ^ local_70;
  uVar38 = uVar36 << 0x28 | uVar36 >> 0x18;
  uVar28 = uVar28 + lVar10 + uVar38;
  uVar39 = uVar39 ^ uVar28;
  uVar39 = uVar39 << 0x30 | uVar39 >> 0x10;
  local_70 = local_70 + uVar39;
  uVar38 = uVar38 ^ local_70;
  uVar36 = uVar38 << 1 | (ulong)((long)uVar38 < 0);
  uVar38 = uVar35 + lVar11 + uVar33;
  uVar27 = uVar27 ^ uVar38;
  uVar27 = uVar27 << 0x20 | uVar27 >> 0x20;
  local_68 = local_68 + uVar27;
  uVar33 = uVar33 ^ local_68;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar35 = uVar38 + lVar17 + uVar33;
  uVar27 = uVar27 ^ uVar35;
  uVar27 = uVar27 << 0x30 | uVar27 >> 0x10;
  local_68 = local_68 + uVar27;
  uVar33 = uVar33 ^ local_68;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar38 = uVar30 + lVar15 + uVar37;
  uVar31 = uVar31 ^ uVar38;
  uVar31 = uVar31 << 0x20 | uVar31 >> 0x20;
  local_60 = local_60 + uVar31;
  uVar37 = uVar37 ^ local_60;
  uVar30 = uVar37 << 0x28 | uVar37 >> 0x18;
  uVar37 = uVar38 + lVar8 + uVar30;
  uVar31 = uVar31 ^ uVar37;
  uVar38 = uVar31 << 0x30 | uVar31 >> 0x10;
  local_60 = local_60 + uVar38;
  uVar30 = uVar30 ^ local_60;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar40 = uVar40 + lVar3 + uVar36;
  uVar38 = uVar38 ^ uVar40;
  uVar38 = uVar38 << 0x20 | uVar38 >> 0x20;
  local_68 = local_68 + uVar38;
  uVar36 = uVar36 ^ local_68;
  uVar31 = uVar36 << 0x28 | uVar36 >> 0x18;
  uVar40 = uVar40 + lVar14 + uVar31;
  uVar38 = uVar38 ^ uVar40;
  uVar38 = uVar38 << 0x30 | uVar38 >> 0x10;
  local_68 = local_68 + uVar38;
  uVar31 = uVar31 ^ local_68;
  uVar36 = uVar31 << 1 | (ulong)((long)uVar31 < 0);
  uVar28 = uVar28 + lVar29 + uVar33;
  uVar34 = uVar34 ^ uVar28;
  uVar31 = uVar34 << 0x20 | uVar34 >> 0x20;
  local_60 = local_60 + uVar31;
  uVar33 = uVar33 ^ local_60;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar28 = uVar28 + lVar4 + uVar33;
  uVar31 = uVar31 ^ uVar28;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  local_60 = local_60 + uVar31;
  uVar33 = uVar33 ^ local_60;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar34 = uVar35 + lVar13 + uVar30;
  uVar39 = uVar39 ^ uVar34;
  uVar35 = uVar39 << 0x20 | uVar39 >> 0x20;
  local_78 = local_78 + uVar35;
  uVar30 = uVar30 ^ local_78;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar34 = uVar34 + lVar9 + uVar30;
  uVar35 = uVar35 ^ uVar34;
  uVar35 = uVar35 << 0x30 | uVar35 >> 0x10;
  local_78 = local_78 + uVar35;
  uVar30 = uVar30 ^ local_78;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar37 = uVar37 + lVar7 + uVar32;
  uVar27 = uVar27 ^ uVar37;
  uVar27 = uVar27 << 0x20 | uVar27 >> 0x20;
  local_70 = local_70 + uVar27;
  uVar32 = uVar32 ^ local_70;
  uVar32 = uVar32 << 0x28 | uVar32 >> 0x18;
  uVar37 = uVar37 + lVar5 + uVar32;
  uVar27 = uVar27 ^ uVar37;
  uVar27 = uVar27 << 0x30 | uVar27 >> 0x10;
  local_70 = local_70 + uVar27;
  uVar32 = uVar32 ^ local_70;
  uVar32 = uVar32 << 1 | (ulong)((long)uVar32 < 0);
  uVar39 = uVar40 + lVar13 + uVar32;
  uVar31 = uVar31 ^ uVar39;
  uVar31 = uVar31 << 0x20 | uVar31 >> 0x20;
  local_78 = local_78 + uVar31;
  uVar32 = uVar32 ^ local_78;
  uVar32 = uVar32 << 0x28 | uVar32 >> 0x18;
  uVar40 = uVar39 + lVar10 + uVar32;
  uVar31 = uVar31 ^ uVar40;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  local_78 = local_78 + uVar31;
  uVar32 = uVar32 ^ local_78;
  uVar32 = uVar32 << 1 | (ulong)((long)uVar32 < 0);
  uVar28 = uVar28 + lVar14 + uVar36;
  uVar35 = uVar35 ^ uVar28;
  uVar39 = uVar35 << 0x20 | uVar35 >> 0x20;
  local_70 = local_70 + uVar39;
  uVar36 = uVar36 ^ local_70;
  uVar35 = uVar36 << 0x28 | uVar36 >> 0x18;
  uVar28 = uVar28 + lVar29 + uVar35;
  uVar39 = uVar39 ^ uVar28;
  uVar36 = uVar39 << 0x30 | uVar39 >> 0x10;
  local_70 = local_70 + uVar36;
  uVar35 = uVar35 ^ local_70;
  uVar35 = uVar35 << 1 | (ulong)((long)uVar35 < 0);
  uVar34 = uVar34 + lVar7 + uVar33;
  uVar27 = uVar27 ^ uVar34;
  uVar27 = uVar27 << 0x20 | uVar27 >> 0x20;
  local_68 = local_68 + uVar27;
  uVar33 = uVar33 ^ local_68;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar34 = uVar34 + lVar4 + uVar33;
  uVar27 = uVar27 ^ uVar34;
  uVar27 = uVar27 << 0x30 | uVar27 >> 0x10;
  local_68 = local_68 + uVar27;
  uVar33 = uVar33 ^ local_68;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar37 = uVar37 + lVar17 + uVar30;
  uVar38 = uVar38 ^ uVar37;
  uVar38 = uVar38 << 0x20 | uVar38 >> 0x20;
  local_60 = local_60 + uVar38;
  uVar30 = uVar30 ^ local_60;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar37 = uVar37 + lVar15 + uVar30;
  uVar38 = uVar38 ^ uVar37;
  uVar38 = uVar38 << 0x30 | uVar38 >> 0x10;
  local_60 = local_60 + uVar38;
  uVar30 = uVar30 ^ local_60;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar39 = uVar40 + lVar12 + uVar35;
  uVar38 = uVar38 ^ uVar39;
  uVar38 = uVar38 << 0x20 | uVar38 >> 0x20;
  local_68 = local_68 + uVar38;
  uVar35 = uVar35 ^ local_68;
  uVar35 = uVar35 << 0x28 | uVar35 >> 0x18;
  uVar39 = uVar39 + lVar16 + uVar35;
  uVar38 = uVar38 ^ uVar39;
  uVar38 = uVar38 << 0x30 | uVar38 >> 0x10;
  local_68 = local_68 + uVar38;
  uVar35 = uVar35 ^ local_68;
  uVar35 = uVar35 << 1 | (ulong)((long)uVar35 < 0);
  uVar28 = uVar28 + lVar5 + uVar33;
  uVar31 = uVar31 ^ uVar28;
  uVar31 = uVar31 << 0x20 | uVar31 >> 0x20;
  local_60 = local_60 + uVar31;
  uVar33 = uVar33 ^ local_60;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar28 = uVar28 + lVar8 + uVar33;
  uVar31 = uVar31 ^ uVar28;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  local_60 = local_60 + uVar31;
  uVar33 = uVar33 ^ local_60;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar34 = uVar34 + lVar9 + uVar30;
  uVar36 = uVar36 ^ uVar34;
  uVar36 = uVar36 << 0x20 | uVar36 >> 0x20;
  local_78 = local_78 + uVar36;
  uVar30 = uVar30 ^ local_78;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar34 = uVar34 + lVar3 + uVar30;
  uVar36 = uVar36 ^ uVar34;
  uVar36 = uVar36 << 0x30 | uVar36 >> 0x10;
  local_78 = local_78 + uVar36;
  uVar30 = uVar30 ^ local_78;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar37 = uVar37 + lVar11 + uVar32;
  uVar27 = uVar27 ^ uVar37;
  uVar27 = uVar27 << 0x20 | uVar27 >> 0x20;
  local_70 = local_70 + uVar27;
  uVar32 = uVar32 ^ local_70;
  uVar32 = uVar32 << 0x28 | uVar32 >> 0x18;
  uVar37 = uVar37 + lVar6 + uVar32;
  uVar27 = uVar27 ^ uVar37;
  uVar27 = uVar27 << 0x30 | uVar27 >> 0x10;
  local_70 = local_70 + uVar27;
  uVar32 = uVar32 ^ local_70;
  uVar32 = uVar32 << 1 | (ulong)((long)uVar32 < 0);
  uVar39 = uVar39 + lVar9 + uVar32;
  uVar31 = uVar31 ^ uVar39;
  uVar31 = uVar31 << 0x20 | uVar31 >> 0x20;
  local_78 = local_78 + uVar31;
  uVar32 = uVar32 ^ local_78;
  uVar32 = uVar32 << 0x28 | uVar32 >> 0x18;
  uVar39 = uVar39 + lVar11 + uVar32;
  uVar31 = uVar31 ^ uVar39;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  local_78 = local_78 + uVar31;
  uVar32 = uVar32 ^ local_78;
  uVar32 = uVar32 << 1 | (ulong)((long)uVar32 < 0);
  uVar28 = uVar28 + lVar5 + uVar35;
  uVar36 = uVar36 ^ uVar28;
  uVar36 = uVar36 << 0x20 | uVar36 >> 0x20;
  local_70 = local_70 + uVar36;
  uVar35 = uVar35 ^ local_70;
  uVar35 = uVar35 << 0x28 | uVar35 >> 0x18;
  uVar28 = uVar28 + lVar3 + uVar35;
  uVar36 = uVar36 ^ uVar28;
  uVar36 = uVar36 << 0x30 | uVar36 >> 0x10;
  local_70 = local_70 + uVar36;
  uVar35 = uVar35 ^ local_70;
  uVar35 = uVar35 << 1 | (ulong)((long)uVar35 < 0);
  uVar34 = uVar34 + lVar15 + uVar33;
  uVar27 = uVar27 ^ uVar34;
  uVar27 = uVar27 << 0x20 | uVar27 >> 0x20;
  local_68 = local_68 + uVar27;
  uVar33 = uVar33 ^ local_68;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar34 = uVar34 + lVar14 + uVar33;
  uVar27 = uVar27 ^ uVar34;
  uVar27 = uVar27 << 0x30 | uVar27 >> 0x10;
  local_68 = local_68 + uVar27;
  uVar33 = uVar33 ^ local_68;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar37 = uVar37 + lVar13 + uVar30;
  uVar38 = uVar38 ^ uVar37;
  uVar38 = uVar38 << 0x20 | uVar38 >> 0x20;
  local_60 = local_60 + uVar38;
  uVar30 = uVar30 ^ local_60;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar37 = uVar37 + lVar16 + uVar30;
  uVar38 = uVar38 ^ uVar37;
  uVar38 = uVar38 << 0x30 | uVar38 >> 0x10;
  local_60 = local_60 + uVar38;
  uVar30 = uVar30 ^ local_60;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar39 = uVar39 + lVar4 + uVar35;
  uVar38 = uVar38 ^ uVar39;
  uVar38 = uVar38 << 0x20 | uVar38 >> 0x20;
  local_68 = local_68 + uVar38;
  uVar35 = uVar35 ^ local_68;
  uVar35 = uVar35 << 0x28 | uVar35 >> 0x18;
  uVar39 = uVar39 + lVar8 + uVar35;
  uVar38 = uVar38 ^ uVar39;
  uVar38 = uVar38 << 0x30 | uVar38 >> 0x10;
  local_68 = local_68 + uVar38;
  uVar35 = uVar35 ^ local_68;
  uVar35 = uVar35 << 1 | (ulong)((long)uVar35 < 0);
  uVar28 = uVar28 + lVar7 + uVar33;
  uVar31 = uVar31 ^ uVar28;
  uVar31 = uVar31 << 0x20 | uVar31 >> 0x20;
  local_60 = local_60 + uVar31;
  uVar33 = uVar33 ^ local_60;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar28 = uVar28 + lVar12 + uVar33;
  uVar31 = uVar31 ^ uVar28;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  local_60 = local_60 + uVar31;
  uVar33 = uVar33 ^ local_60;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar34 = uVar34 + lVar6 + uVar30;
  uVar36 = uVar36 ^ uVar34;
  uVar36 = uVar36 << 0x20 | uVar36 >> 0x20;
  local_78 = local_78 + uVar36;
  uVar30 = uVar30 ^ local_78;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar34 = uVar34 + lVar29 + uVar30;
  uVar36 = uVar36 ^ uVar34;
  uVar36 = uVar36 << 0x30 | uVar36 >> 0x10;
  local_78 = local_78 + uVar36;
  uVar30 = uVar30 ^ local_78;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar37 = uVar37 + lVar17 + uVar32;
  uVar27 = uVar27 ^ uVar37;
  uVar27 = uVar27 << 0x20 | uVar27 >> 0x20;
  local_70 = local_70 + uVar27;
  uVar32 = uVar32 ^ local_70;
  uVar32 = uVar32 << 0x28 | uVar32 >> 0x18;
  uVar37 = uVar37 + lVar10 + uVar32;
  uVar27 = uVar27 ^ uVar37;
  uVar27 = uVar27 << 0x30 | uVar27 >> 0x10;
  local_70 = local_70 + uVar27;
  uVar32 = uVar32 ^ local_70;
  uVar32 = uVar32 << 1 | (ulong)((long)uVar32 < 0);
  uVar39 = uVar39 + lVar11 + uVar32;
  uVar31 = uVar31 ^ uVar39;
  uVar31 = uVar31 << 0x20 | uVar31 >> 0x20;
  local_78 = local_78 + uVar31;
  uVar32 = uVar32 ^ local_78;
  uVar32 = uVar32 << 0x28 | uVar32 >> 0x18;
  uVar40 = uVar39 + lVar29 + uVar32;
  uVar31 = uVar31 ^ uVar40;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  local_78 = local_78 + uVar31;
  uVar32 = uVar32 ^ local_78;
  uVar32 = uVar32 << 1 | (ulong)((long)uVar32 < 0);
  uVar28 = uVar28 + lVar7 + uVar35;
  uVar36 = uVar36 ^ uVar28;
  uVar36 = uVar36 << 0x20 | uVar36 >> 0x20;
  local_70 = local_70 + uVar36;
  uVar35 = uVar35 ^ local_70;
  uVar35 = uVar35 << 0x28 | uVar35 >> 0x18;
  uVar28 = uVar28 + lVar9 + uVar35;
  uVar36 = uVar36 ^ uVar28;
  uVar39 = uVar36 << 0x30 | uVar36 >> 0x10;
  local_70 = local_70 + uVar39;
  uVar35 = uVar35 ^ local_70;
  uVar35 = uVar35 << 1 | (ulong)((long)uVar35 < 0);
  uVar34 = uVar34 + lVar4 + uVar33;
  uVar27 = uVar27 ^ uVar34;
  uVar27 = uVar27 << 0x20 | uVar27 >> 0x20;
  local_68 = local_68 + uVar27;
  uVar33 = uVar33 ^ local_68;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar34 = uVar34 + lVar6 + uVar33;
  uVar27 = uVar27 ^ uVar34;
  uVar27 = uVar27 << 0x30 | uVar27 >> 0x10;
  local_68 = local_68 + uVar27;
  uVar33 = uVar33 ^ local_68;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar37 = uVar37 + lVar12 + uVar30;
  uVar38 = uVar38 ^ uVar37;
  uVar38 = uVar38 << 0x20 | uVar38 >> 0x20;
  local_60 = local_60 + uVar38;
  uVar30 = uVar30 ^ local_60;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar37 = uVar37 + lVar17 + uVar30;
  uVar38 = uVar38 ^ uVar37;
  uVar38 = uVar38 << 0x30 | uVar38 >> 0x10;
  local_60 = local_60 + uVar38;
  uVar30 = uVar30 ^ local_60;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar36 = uVar40 + lVar16 + uVar35;
  uVar38 = uVar38 ^ uVar36;
  uVar38 = uVar38 << 0x20 | uVar38 >> 0x20;
  local_68 = local_68 + uVar38;
  uVar35 = uVar35 ^ local_68;
  uVar35 = uVar35 << 0x28 | uVar35 >> 0x18;
  uVar40 = uVar36 + lVar3 + uVar35;
  uVar38 = uVar38 ^ uVar40;
  uVar38 = uVar38 << 0x30 | uVar38 >> 0x10;
  local_68 = local_68 + uVar38;
  uVar35 = uVar35 ^ local_68;
  uVar36 = uVar35 << 1 | (ulong)((long)uVar35 < 0);
  uVar28 = uVar28 + lVar13 + uVar33;
  uVar31 = uVar31 ^ uVar28;
  uVar31 = uVar31 << 0x20 | uVar31 >> 0x20;
  local_60 = local_60 + uVar31;
  uVar33 = uVar33 ^ local_60;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar28 = uVar28 + lVar14 + uVar33;
  uVar31 = uVar31 ^ uVar28;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  local_60 = local_60 + uVar31;
  uVar33 = uVar33 ^ local_60;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar34 = uVar34 + lVar8 + uVar30;
  uVar39 = uVar39 ^ uVar34;
  uVar39 = uVar39 << 0x20 | uVar39 >> 0x20;
  local_78 = local_78 + uVar39;
  uVar30 = uVar30 ^ local_78;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar35 = uVar34 + lVar10 + uVar30;
  uVar39 = uVar39 ^ uVar35;
  uVar39 = uVar39 << 0x30 | uVar39 >> 0x10;
  local_78 = local_78 + uVar39;
  uVar30 = uVar30 ^ local_78;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar37 = uVar37 + lVar5 + uVar32;
  uVar27 = uVar27 ^ uVar37;
  uVar27 = uVar27 << 0x20 | uVar27 >> 0x20;
  local_70 = local_70 + uVar27;
  uVar32 = uVar32 ^ local_70;
  uVar32 = uVar32 << 0x28 | uVar32 >> 0x18;
  uVar37 = uVar37 + lVar15 + uVar32;
  uVar27 = uVar27 ^ uVar37;
  uVar27 = uVar27 << 0x30 | uVar27 >> 0x10;
  local_70 = local_70 + uVar27;
  uVar32 = uVar32 ^ local_70;
  uVar32 = uVar32 << 1 | (ulong)((long)uVar32 < 0);
  uVar34 = uVar40 + lVar4 + uVar32;
  uVar31 = uVar31 ^ uVar34;
  uVar31 = uVar31 << 0x20 | uVar31 >> 0x20;
  local_78 = local_78 + uVar31;
  uVar32 = uVar32 ^ local_78;
  uVar32 = uVar32 << 0x28 | uVar32 >> 0x18;
  uVar40 = uVar34 + lVar14 + uVar32;
  uVar31 = uVar31 ^ uVar40;
  uVar34 = uVar31 << 0x30 | uVar31 >> 0x10;
  local_78 = local_78 + uVar34;
  uVar32 = uVar32 ^ local_78;
  uVar32 = uVar32 << 1 | (ulong)((long)uVar32 < 0);
  uVar28 = uVar28 + lVar8 + uVar36;
  uVar39 = uVar39 ^ uVar28;
  uVar39 = uVar39 << 0x20 | uVar39 >> 0x20;
  local_70 = local_70 + uVar39;
  uVar36 = uVar36 ^ local_70;
  uVar31 = uVar36 << 0x28 | uVar36 >> 0x18;
  uVar28 = uVar28 + lVar12 + uVar31;
  uVar39 = uVar39 ^ uVar28;
  uVar39 = uVar39 << 0x30 | uVar39 >> 0x10;
  local_70 = local_70 + uVar39;
  uVar31 = uVar31 ^ local_70;
  uVar36 = uVar31 << 1 | (ulong)((long)uVar31 < 0);
  uVar31 = uVar35 + lVar29 + uVar33;
  uVar27 = uVar27 ^ uVar31;
  uVar27 = uVar27 << 0x20 | uVar27 >> 0x20;
  local_68 = local_68 + uVar27;
  uVar33 = uVar33 ^ local_68;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar35 = uVar31 + lVar13 + uVar33;
  uVar27 = uVar27 ^ uVar35;
  uVar27 = uVar27 << 0x30 | uVar27 >> 0x10;
  local_68 = local_68 + uVar27;
  uVar33 = uVar33 ^ local_68;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar37 = uVar37 + lVar10 + uVar30;
  uVar38 = uVar38 ^ uVar37;
  uVar31 = uVar38 << 0x20 | uVar38 >> 0x20;
  local_60 = local_60 + uVar31;
  uVar30 = uVar30 ^ local_60;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar38 = uVar37 + lVar5 + uVar30;
  uVar31 = uVar31 ^ uVar38;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  local_60 = local_60 + uVar31;
  uVar30 = uVar30 ^ local_60;
  uVar37 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar40 = uVar40 + lVar6 + uVar36;
  uVar31 = uVar31 ^ uVar40;
  uVar30 = uVar31 << 0x20 | uVar31 >> 0x20;
  local_68 = local_68 + uVar30;
  uVar36 = uVar36 ^ local_68;
  uVar36 = uVar36 << 0x28 | uVar36 >> 0x18;
  uVar40 = uVar40 + lVar15 + uVar36;
  uVar30 = uVar30 ^ uVar40;
  uVar31 = uVar30 << 0x30 | uVar30 >> 0x10;
  local_68 = local_68 + uVar31;
  uVar36 = uVar36 ^ local_68;
  uVar36 = uVar36 << 1 | (ulong)((long)uVar36 < 0);
  uVar28 = uVar28 + lVar9 + uVar33;
  uVar34 = uVar34 ^ uVar28;
  uVar30 = uVar34 << 0x20 | uVar34 >> 0x20;
  local_60 = local_60 + uVar30;
  uVar33 = uVar33 ^ local_60;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar28 = uVar28 + lVar7 + uVar33;
  uVar30 = uVar30 ^ uVar28;
  uVar34 = uVar30 << 0x30 | uVar30 >> 0x10;
  local_60 = local_60 + uVar34;
  uVar33 = uVar33 ^ local_60;
  uVar30 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar35 = uVar35 + lVar17 + uVar37;
  uVar39 = uVar39 ^ uVar35;
  uVar39 = uVar39 << 0x20 | uVar39 >> 0x20;
  local_78 = local_78 + uVar39;
  uVar37 = uVar37 ^ local_78;
  uVar33 = uVar37 << 0x28 | uVar37 >> 0x18;
  uVar35 = uVar35 + lVar16 + uVar33;
  uVar39 = uVar39 ^ uVar35;
  uVar39 = uVar39 << 0x30 | uVar39 >> 0x10;
  local_78 = local_78 + uVar39;
  uVar33 = uVar33 ^ local_78;
  uVar37 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar33 = uVar38 + lVar3 + uVar32;
  uVar27 = uVar27 ^ uVar33;
  uVar27 = uVar27 << 0x20 | uVar27 >> 0x20;
  local_70 = local_70 + uVar27;
  uVar32 = uVar32 ^ local_70;
  uVar32 = uVar32 << 0x28 | uVar32 >> 0x18;
  uVar38 = uVar33 + lVar11 + uVar32;
  uVar27 = uVar27 ^ uVar38;
  uVar27 = uVar27 << 0x30 | uVar27 >> 0x10;
  local_70 = local_70 + uVar27;
  uVar32 = uVar32 ^ local_70;
  uVar32 = uVar32 << 1 | (ulong)((long)uVar32 < 0);
  uVar40 = uVar40 + lVar14 + uVar32;
  uVar34 = uVar34 ^ uVar40;
  uVar33 = uVar34 << 0x20 | uVar34 >> 0x20;
  local_78 = local_78 + uVar33;
  uVar32 = uVar32 ^ local_78;
  uVar32 = uVar32 << 0x28 | uVar32 >> 0x18;
  uVar40 = uVar40 + lVar7 + uVar32;
  uVar33 = uVar33 ^ uVar40;
  uVar34 = uVar33 << 0x30 | uVar33 >> 0x10;
  local_78 = local_78 + uVar34;
  uVar32 = uVar32 ^ local_78;
  uVar33 = uVar32 << 1 | (ulong)((long)uVar32 < 0);
  uVar28 = uVar28 + lVar3 + uVar36;
  uVar39 = uVar39 ^ uVar28;
  uVar39 = uVar39 << 0x20 | uVar39 >> 0x20;
  local_70 = local_70 + uVar39;
  uVar36 = uVar36 ^ local_70;
  uVar36 = uVar36 << 0x28 | uVar36 >> 0x18;
  uVar32 = uVar28 + lVar17 + uVar36;
  uVar39 = uVar39 ^ uVar32;
  uVar39 = uVar39 << 0x30 | uVar39 >> 0x10;
  local_70 = local_70 + uVar39;
  uVar36 = uVar36 ^ local_70;
  uVar36 = uVar36 << 1 | (ulong)((long)uVar36 < 0);
  uVar28 = uVar35 + lVar16 + uVar30;
  uVar27 = uVar27 ^ uVar28;
  uVar27 = uVar27 << 0x20 | uVar27 >> 0x20;
  local_68 = local_68 + uVar27;
  uVar30 = uVar30 ^ local_68;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar35 = uVar28 + lVar15 + uVar30;
  uVar27 = uVar27 ^ uVar35;
  uVar28 = uVar27 << 0x30 | uVar27 >> 0x10;
  local_68 = local_68 + uVar28;
  uVar30 = uVar30 ^ local_68;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar38 = uVar38 + lVar6 + uVar37;
  uVar31 = uVar31 ^ uVar38;
  uVar31 = uVar31 << 0x20 | uVar31 >> 0x20;
  local_60 = local_60 + uVar31;
  uVar37 = uVar37 ^ local_60;
  uVar27 = uVar37 << 0x28 | uVar37 >> 0x18;
  uVar38 = uVar38 + lVar12 + uVar27;
  uVar31 = uVar31 ^ uVar38;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  local_60 = local_60 + uVar31;
  uVar27 = uVar27 ^ local_60;
  uVar37 = uVar27 << 1 | (ulong)((long)uVar27 < 0);
  uVar40 = uVar40 + lVar29 + uVar36;
  uVar31 = uVar31 ^ uVar40;
  uVar27 = uVar31 << 0x20 | uVar31 >> 0x20;
  local_68 = local_68 + uVar27;
  uVar36 = uVar36 ^ local_68;
  uVar31 = uVar36 << 0x28 | uVar36 >> 0x18;
  uVar40 = uVar40 + lVar9 + uVar31;
  uVar27 = uVar27 ^ uVar40;
  uVar27 = uVar27 << 0x30 | uVar27 >> 0x10;
  local_68 = uVar27 + local_68;
  uVar31 = uVar31 ^ local_68;
  uVar36 = uVar31 << 1 | (ulong)((long)uVar31 < 0);
  uVar32 = uVar32 + lVar8 + uVar30;
  uVar34 = uVar34 ^ uVar32;
  uVar31 = uVar34 << 0x20 | uVar34 >> 0x20;
  local_60 = local_60 + uVar31;
  uVar30 = uVar30 ^ local_60;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar32 = uVar32 + lVar5 + uVar30;
  uVar31 = uVar31 ^ uVar32;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  local_60 = local_60 + uVar31;
  uVar30 = uVar30 ^ local_60;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar34 = uVar35 + lVar11 + uVar37;
  uVar39 = uVar39 ^ uVar34;
  uVar35 = uVar39 << 0x20 | uVar39 >> 0x20;
  local_78 = local_78 + uVar35;
  uVar37 = uVar37 ^ local_78;
  uVar37 = uVar37 << 0x28 | uVar37 >> 0x18;
  uVar34 = uVar34 + lVar4 + uVar37;
  uVar35 = uVar35 ^ uVar34;
  uVar35 = uVar35 << 0x30 | uVar35 >> 0x10;
  local_78 = local_78 + uVar35;
  uVar37 = uVar37 ^ local_78;
  uVar37 = uVar37 << 1 | (ulong)((long)uVar37 < 0);
  uVar38 = uVar38 + lVar10 + uVar33;
  uVar28 = uVar28 ^ uVar38;
  uVar28 = uVar28 << 0x20 | uVar28 >> 0x20;
  local_70 = local_70 + uVar28;
  uVar33 = uVar33 ^ local_70;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar38 = uVar38 + lVar13 + uVar33;
  uVar28 = uVar28 ^ uVar38;
  uVar28 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_70 = local_70 + uVar28;
  uVar33 = uVar33 ^ local_70;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar39 = uVar40 + lVar15 + uVar33;
  uVar31 = uVar31 ^ uVar39;
  uVar31 = uVar31 << 0x20 | uVar31 >> 0x20;
  local_78 = local_78 + uVar31;
  uVar33 = uVar33 ^ local_78;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar40 = uVar39 + lVar13 + uVar33;
  uVar31 = uVar31 ^ uVar40;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  local_78 = local_78 + uVar31;
  uVar33 = uVar33 ^ local_78;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar32 = uVar32 + lVar9 + uVar36;
  uVar35 = uVar35 ^ uVar32;
  uVar39 = uVar35 << 0x20 | uVar35 >> 0x20;
  local_70 = local_70 + uVar39;
  uVar36 = uVar36 ^ local_70;
  uVar35 = uVar36 << 0x28 | uVar36 >> 0x18;
  uVar32 = uVar32 + lVar16 + uVar35;
  uVar39 = uVar39 ^ uVar32;
  uVar39 = uVar39 << 0x30 | uVar39 >> 0x10;
  local_70 = local_70 + uVar39;
  uVar35 = uVar35 ^ local_70;
  uVar35 = uVar35 << 1 | (ulong)((long)uVar35 < 0);
  uVar34 = uVar34 + lVar14 + uVar30;
  uVar28 = uVar28 ^ uVar34;
  uVar28 = uVar28 << 0x20 | uVar28 >> 0x20;
  local_68 = local_68 + uVar28;
  uVar30 = uVar30 ^ local_68;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar34 = uVar34 + lVar3 + uVar30;
  uVar28 = uVar28 ^ uVar34;
  uVar28 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_68 = local_68 + uVar28;
  uVar30 = uVar30 ^ local_68;
  uVar38 = uVar38 + lVar5 + uVar37;
  uVar27 = uVar27 ^ uVar38;
  uVar27 = uVar27 << 0x20 | uVar27 >> 0x20;
  local_60 = local_60 + uVar27;
  uVar37 = uVar37 ^ local_60;
  uVar37 = uVar37 << 0x28 | uVar37 >> 0x18;
  uVar38 = uVar38 + lVar11 + uVar37;
  uVar27 = uVar27 ^ uVar38;
  uVar27 = uVar27 << 0x30 | uVar27 >> 0x10;
  local_60 = local_60 + uVar27;
  uVar36 = uVar40 + lVar7 + uVar35;
  uVar27 = uVar27 ^ uVar36;
  uVar27 = uVar27 << 0x20 | uVar27 >> 0x20;
  local_68 = local_68 + uVar27;
  uVar35 = uVar35 ^ local_68;
  uVar35 = uVar35 << 0x28 | uVar35 >> 0x18;
  uVar40 = uVar36 + lVar29 + uVar35;
  uVar27 = uVar27 ^ uVar40;
  uVar27 = uVar27 << 0x30 | uVar27 >> 0x10;
  local_68 = uVar27 + local_68;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar37 = uVar37 ^ local_60;
  uVar37 = uVar37 << 1 | (ulong)((long)uVar37 < 0);
  uVar35 = uVar35 ^ local_68;
  uVar36 = uVar35 << 1 | (ulong)((long)uVar35 < 0);
  uVar32 = uVar32 + lVar17 + uVar30;
  uVar31 = uVar31 ^ uVar32;
  uVar31 = uVar31 << 0x20 | uVar31 >> 0x20;
  local_60 = local_60 + uVar31;
  uVar30 = uVar30 ^ local_60;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar32 = uVar32 + lVar6 + uVar30;
  uVar31 = uVar31 ^ uVar32;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  local_60 = local_60 + uVar31;
  uVar30 = uVar30 ^ local_60;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar34 = uVar34 + lVar10 + uVar37;
  uVar39 = uVar39 ^ uVar34;
  uVar39 = uVar39 << 0x20 | uVar39 >> 0x20;
  local_78 = local_78 + uVar39;
  uVar37 = uVar37 ^ local_78;
  uVar37 = uVar37 << 0x28 | uVar37 >> 0x18;
  uVar35 = uVar34 + lVar8 + uVar37;
  uVar39 = uVar39 ^ uVar35;
  uVar39 = uVar39 << 0x30 | uVar39 >> 0x10;
  local_78 = local_78 + uVar39;
  uVar37 = uVar37 ^ local_78;
  uVar37 = uVar37 << 1 | (ulong)((long)uVar37 < 0);
  uVar38 = uVar38 + lVar4 + uVar33;
  uVar28 = uVar28 ^ uVar38;
  uVar28 = uVar28 << 0x20 | uVar28 >> 0x20;
  local_70 = local_70 + uVar28;
  uVar33 = uVar33 ^ local_70;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar38 = uVar38 + lVar12 + uVar33;
  uVar28 = uVar28 ^ uVar38;
  uVar28 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_70 = local_70 + uVar28;
  uVar33 = uVar33 ^ local_70;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar34 = uVar40 + lVar8 + uVar33;
  uVar31 = uVar31 ^ uVar34;
  uVar31 = uVar31 << 0x20 | uVar31 >> 0x20;
  local_78 = local_78 + uVar31;
  uVar33 = uVar33 ^ local_78;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar40 = uVar34 + lVar17 + uVar33;
  uVar31 = uVar31 ^ uVar40;
  uVar34 = uVar31 << 0x30 | uVar31 >> 0x10;
  local_78 = local_78 + uVar34;
  uVar33 = uVar33 ^ local_78;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar32 = uVar32 + lVar16 + uVar36;
  uVar39 = uVar39 ^ uVar32;
  uVar39 = uVar39 << 0x20 | uVar39 >> 0x20;
  local_70 = local_70 + uVar39;
  uVar36 = uVar36 ^ local_70;
  uVar31 = uVar36 << 0x28 | uVar36 >> 0x18;
  uVar32 = uVar32 + lVar11 + uVar31;
  uVar39 = uVar39 ^ uVar32;
  uVar39 = uVar39 << 0x30 | uVar39 >> 0x10;
  local_70 = local_70 + uVar39;
  uVar31 = uVar31 ^ local_70;
  uVar36 = uVar31 << 1 | (ulong)((long)uVar31 < 0);
  uVar31 = uVar35 + lVar13 + uVar30;
  uVar28 = uVar28 ^ uVar31;
  uVar28 = uVar28 << 0x20 | uVar28 >> 0x20;
  local_68 = local_68 + uVar28;
  uVar30 = uVar30 ^ local_68;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar35 = uVar31 + lVar5 + uVar30;
  uVar28 = uVar28 ^ uVar35;
  uVar28 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_68 = local_68 + uVar28;
  uVar31 = uVar38 + lVar29 + uVar37;
  uVar27 = uVar27 ^ uVar31;
  uVar38 = uVar27 << 0x20 | uVar27 >> 0x20;
  local_60 = local_60 + uVar38;
  uVar37 = uVar37 ^ local_60;
  uVar27 = uVar37 << 0x28 | uVar37 >> 0x18;
  uVar31 = uVar31 + lVar10 + uVar27;
  uVar38 = uVar38 ^ uVar31;
  uVar37 = uVar38 << 0x30 | uVar38 >> 0x10;
  uVar30 = uVar30 ^ local_68;
  local_60 = local_60 + uVar37;
  uVar38 = uVar40 + lVar14 + uVar36;
  uVar37 = uVar37 ^ uVar38;
  uVar37 = uVar37 << 0x20 | uVar37 >> 0x20;
  local_68 = local_68 + uVar37;
  uVar36 = uVar36 ^ local_68;
  uVar36 = uVar36 << 0x28 | uVar36 >> 0x18;
  uVar40 = uVar38 + lVar4 + uVar36;
  uVar37 = uVar37 ^ uVar40;
  uVar38 = uVar37 << 0x30 | uVar37 >> 0x10;
  local_68 = uVar38 + local_68;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar27 = uVar27 ^ local_60;
  uVar37 = uVar27 << 1 | (ulong)((long)uVar27 < 0);
  uVar31 = uVar31 + uVar33 + lVar12;
  uVar36 = uVar36 ^ local_68;
  uVar36 = uVar36 << 1 | (ulong)((long)uVar36 < 0);
  uVar27 = uVar32 + lVar15 + uVar30;
  uVar34 = uVar34 ^ uVar27;
  uVar34 = uVar34 << 0x20 | uVar34 >> 0x20;
  local_60 = local_60 + uVar34;
  uVar30 = uVar30 ^ local_60;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar32 = uVar27 + lVar9 + uVar30;
  uVar34 = uVar34 ^ uVar32;
  uVar34 = uVar34 << 0x30 | uVar34 >> 0x10;
  local_60 = local_60 + uVar34;
  uVar30 = uVar30 ^ local_60;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar35 = uVar35 + lVar3 + uVar37;
  uVar39 = uVar39 ^ uVar35;
  uVar39 = uVar39 << 0x20 | uVar39 >> 0x20;
  local_78 = local_78 + uVar39;
  uVar37 = uVar37 ^ local_78;
  uVar27 = uVar37 << 0x28 | uVar37 >> 0x18;
  uVar35 = uVar35 + lVar6 + uVar27;
  uVar39 = uVar39 ^ uVar35;
  uVar39 = uVar39 << 0x30 | uVar39 >> 0x10;
  local_78 = local_78 + uVar39;
  uVar27 = uVar27 ^ local_78;
  uVar37 = uVar27 << 1 | (ulong)((long)uVar27 < 0);
  uVar28 = uVar28 ^ uVar31;
  uVar27 = uVar28 << 0x20 | uVar28 >> 0x20;
  local_70 = local_70 + uVar27;
  uVar33 = uVar33 ^ local_70;
  uVar28 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar31 = uVar31 + lVar7 + uVar28;
  uVar27 = uVar27 ^ uVar31;
  uVar27 = uVar27 << 0x30 | uVar27 >> 0x10;
  local_70 = local_70 + uVar27;
  uVar28 = uVar28 ^ local_70;
  uVar28 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  uVar40 = uVar40 + lVar12 + uVar28;
  uVar34 = uVar34 ^ uVar40;
  uVar33 = uVar34 << 0x20 | uVar34 >> 0x20;
  local_78 = local_78 + uVar33;
  uVar28 = uVar28 ^ local_78;
  uVar28 = uVar28 << 0x28 | uVar28 >> 0x18;
  uVar40 = uVar40 + lVar4 + uVar28;
  uVar33 = uVar33 ^ uVar40;
  uVar34 = uVar33 << 0x30 | uVar33 >> 0x10;
  local_78 = local_78 + uVar34;
  uVar28 = uVar28 ^ local_78;
  uVar33 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  uVar28 = uVar32 + lVar10 + uVar36;
  uVar39 = uVar39 ^ uVar28;
  uVar39 = uVar39 << 0x20 | uVar39 >> 0x20;
  local_70 = local_70 + uVar39;
  uVar36 = uVar36 ^ local_70;
  uVar36 = uVar36 << 0x28 | uVar36 >> 0x18;
  uVar32 = uVar28 + lVar6 + uVar36;
  uVar39 = uVar39 ^ uVar32;
  uVar39 = uVar39 << 0x30 | uVar39 >> 0x10;
  local_70 = local_70 + uVar39;
  uVar36 = uVar36 ^ local_70;
  uVar36 = uVar36 << 1 | (ulong)((long)uVar36 < 0);
  uVar28 = uVar35 + uVar30 + lVar9;
  uVar27 = uVar27 ^ uVar28;
  uVar27 = uVar27 << 0x20 | uVar27 >> 0x20;
  local_68 = local_68 + uVar27;
  uVar30 = uVar30 ^ local_68;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar35 = uVar28 + lVar8 + uVar30;
  uVar27 = uVar27 ^ uVar35;
  uVar28 = uVar27 << 0x30 | uVar27 >> 0x10;
  local_68 = local_68 + uVar28;
  uVar27 = uVar31 + lVar3 + uVar37;
  uVar38 = uVar38 ^ uVar27;
  uVar38 = uVar38 << 0x20 | uVar38 >> 0x20;
  local_60 = local_60 + uVar38;
  uVar37 = uVar37 ^ local_60;
  uVar37 = uVar37 << 0x28 | uVar37 >> 0x18;
  uVar30 = uVar30 ^ local_68;
  uVar31 = uVar27 + lVar7 + uVar37;
  uVar38 = uVar38 ^ uVar31;
  uVar27 = uVar38 << 0x30 | uVar38 >> 0x10;
  local_60 = local_60 + uVar27;
  uVar38 = uVar40 + lVar17 + uVar36;
  uVar27 = uVar27 ^ uVar38;
  uVar27 = uVar27 << 0x20 | uVar27 >> 0x20;
  local_68 = local_68 + uVar27;
  uVar36 = uVar36 ^ local_68;
  uVar36 = uVar36 << 0x28 | uVar36 >> 0x18;
  uVar40 = uVar38 + lVar13 + uVar36;
  uVar27 = uVar27 ^ uVar40;
  uVar27 = uVar27 << 0x30 | uVar27 >> 0x10;
  local_68 = uVar27 + local_68;
  uVar31 = uVar31 + lVar15 + uVar33;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar37 = uVar37 ^ local_60;
  uVar38 = uVar37 << 1 | (ulong)((long)uVar37 < 0);
  uVar36 = uVar36 ^ local_68;
  uVar36 = uVar36 << 1 | (ulong)((long)uVar36 < 0);
  uVar32 = uVar32 + lVar11 + uVar30;
  uVar34 = uVar34 ^ uVar32;
  uVar37 = uVar34 << 0x20 | uVar34 >> 0x20;
  local_60 = local_60 + uVar37;
  uVar30 = uVar30 ^ local_60;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar32 = uVar32 + lVar16 + uVar30;
  uVar37 = uVar37 ^ uVar32;
  uVar34 = uVar37 << 0x30 | uVar37 >> 0x10;
  local_60 = local_60 + uVar34;
  uVar30 = uVar30 ^ local_60;
  uVar37 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar35 = uVar35 + lVar5 + uVar38;
  uVar39 = uVar39 ^ uVar35;
  uVar39 = uVar39 << 0x20 | uVar39 >> 0x20;
  local_78 = local_78 + uVar39;
  uVar38 = uVar38 ^ local_78;
  uVar30 = uVar38 << 0x28 | uVar38 >> 0x18;
  uVar35 = uVar35 + lVar14 + uVar30;
  uVar39 = uVar39 ^ uVar35;
  uVar39 = uVar39 << 0x30 | uVar39 >> 0x10;
  local_78 = local_78 + uVar39;
  uVar30 = uVar30 ^ local_78;
  uVar38 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar28 = uVar28 ^ uVar31;
  uVar28 = uVar28 << 0x20 | uVar28 >> 0x20;
  local_70 = local_70 + uVar28;
  uVar33 = uVar33 ^ local_70;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar31 = uVar31 + lVar29 + uVar33;
  uVar28 = uVar28 ^ uVar31;
  uVar28 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_70 = local_70 + uVar28;
  uVar33 = uVar33 ^ local_70;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar40 = uVar40 + lVar29 + uVar33;
  uVar34 = uVar34 ^ uVar40;
  uVar30 = uVar34 << 0x20 | uVar34 >> 0x20;
  local_78 = local_78 + uVar30;
  uVar33 = uVar33 ^ local_78;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar41 = uVar40 + lVar3 + uVar33;
  uVar30 = uVar30 ^ uVar41;
  uVar34 = uVar30 << 0x30 | uVar30 >> 0x10;
  local_78 = local_78 + uVar34;
  uVar33 = uVar33 ^ local_78;
  uVar30 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar32 = uVar32 + lVar4 + uVar36;
  uVar39 = uVar39 ^ uVar32;
  uVar39 = uVar39 << 0x20 | uVar39 >> 0x20;
  local_70 = local_70 + uVar39;
  uVar36 = uVar36 ^ local_70;
  uVar33 = uVar36 << 0x28 | uVar36 >> 0x18;
  uVar32 = uVar32 + lVar5 + uVar33;
  uVar39 = uVar39 ^ uVar32;
  uVar40 = uVar39 << 0x30 | uVar39 >> 0x10;
  local_70 = local_70 + uVar40;
  uVar33 = uVar33 ^ local_70;
  uVar36 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar35 = uVar35 + uVar37 + lVar6;
  uVar28 = uVar28 ^ uVar35;
  uVar28 = uVar28 << 0x20 | uVar28 >> 0x20;
  local_68 = local_68 + uVar28;
  uVar37 = uVar37 ^ local_68;
  uVar33 = uVar37 << 0x28 | uVar37 >> 0x18;
  uVar35 = uVar35 + lVar7 + uVar33;
  uVar28 = uVar28 ^ uVar35;
  uVar28 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_68 = local_68 + uVar28;
  uVar33 = uVar33 ^ local_68;
  uVar37 = uVar31 + lVar8 + uVar38;
  uVar27 = uVar27 ^ uVar37;
  uVar27 = uVar27 << 0x20 | uVar27 >> 0x20;
  local_60 = local_60 + uVar27;
  uVar38 = uVar38 ^ local_60;
  uVar38 = uVar38 << 0x28 | uVar38 >> 0x18;
  uVar37 = uVar37 + lVar9 + uVar38;
  uVar27 = uVar27 ^ uVar37;
  uVar27 = uVar27 << 0x30 | uVar27 >> 0x10;
  local_60 = local_60 + uVar27;
  uVar31 = uVar41 + lVar10 + uVar36;
  uVar27 = uVar27 ^ uVar31;
  uVar27 = uVar27 << 0x20 | uVar27 >> 0x20;
  local_68 = local_68 + uVar27;
  uVar36 = uVar36 ^ local_68;
  uVar36 = uVar36 << 0x28 | uVar36 >> 0x18;
  uVar39 = uVar31 + lVar11 + uVar36;
  uVar27 = uVar27 ^ uVar39;
  uVar27 = uVar27 << 0x30 | uVar27 >> 0x10;
  local_68 = uVar27 + local_68;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar31 = uVar37 + uVar30 + lVar16;
  uVar38 = uVar38 ^ local_60;
  uVar32 = uVar32 + lVar12 + uVar33;
  uVar34 = uVar34 ^ uVar32;
  uVar34 = uVar34 << 0x20 | uVar34 >> 0x20;
  local_60 = local_60 + uVar34;
  uVar33 = uVar33 ^ local_60;
  uVar37 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar33 = uVar32 + lVar13 + uVar37;
  uVar34 = uVar34 ^ uVar33;
  uVar34 = uVar34 << 0x30 | uVar34 >> 0x10;
  uVar28 = uVar28 ^ uVar31;
  uVar28 = uVar28 << 0x20 | uVar28 >> 0x20;
  local_70 = local_70 + uVar28;
  uVar30 = uVar30 ^ local_70;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  local_60 = local_60 + uVar34;
  uVar31 = uVar31 + lVar17 + uVar30;
  uVar28 = uVar28 ^ uVar31;
  uVar32 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_70 = local_70 + uVar32;
  uVar30 = uVar30 ^ local_70;
  uVar28 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar41 = uVar39 + lVar16 + uVar28;
  uVar34 = uVar34 ^ uVar41;
  uVar38 = uVar38 << 1 | (ulong)((long)uVar38 < 0);
  uVar36 = uVar36 ^ local_68;
  uVar39 = uVar36 << 1 | (ulong)((long)uVar36 < 0);
  uVar37 = uVar37 ^ local_60;
  uVar30 = uVar37 << 1 | (ulong)((long)uVar37 < 0);
  uVar35 = uVar35 + lVar14 + uVar38;
  uVar40 = uVar40 ^ uVar35;
  uVar40 = uVar40 << 0x20 | uVar40 >> 0x20;
  local_78 = local_78 + uVar40;
  uVar38 = uVar38 ^ local_78;
  uVar37 = uVar38 << 0x28 | uVar38 >> 0x18;
  uVar36 = uVar35 + lVar15 + uVar37;
  uVar40 = uVar40 ^ uVar36;
  uVar40 = uVar40 << 0x30 | uVar40 >> 0x10;
  local_78 = local_78 + uVar40;
  uVar37 = uVar37 ^ local_78;
  uVar37 = uVar37 << 1 | (ulong)((long)uVar37 < 0);
  uVar38 = uVar34 << 0x20 | uVar34 >> 0x20;
  local_78 = local_78 + uVar38;
  uVar28 = uVar28 ^ local_78;
  uVar28 = uVar28 << 0x28 | uVar28 >> 0x18;
  uVar41 = uVar41 + lVar12 + uVar28;
  uVar38 = uVar38 ^ uVar41;
  uVar35 = uVar38 << 0x30 | uVar38 >> 0x10;
  local_78 = local_78 + uVar35;
  uVar28 = local_78 ^ uVar28;
  uVar28 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  uVar33 = uVar33 + lVar6 + uVar39;
  uVar40 = uVar40 ^ uVar33;
  uVar38 = uVar40 << 0x20 | uVar40 >> 0x20;
  local_70 = local_70 + uVar38;
  uVar39 = uVar39 ^ local_70;
  uVar34 = uVar39 << 0x28 | uVar39 >> 0x18;
  uVar33 = uVar33 + lVar10 + uVar34;
  uVar38 = uVar38 ^ uVar33;
  uVar39 = uVar38 << 0x30 | uVar38 >> 0x10;
  local_70 = local_70 + uVar39;
  uVar34 = local_70 ^ uVar34;
  uVar38 = uVar36 + uVar30 + lVar11;
  uVar32 = uVar32 ^ uVar38;
  uVar32 = uVar32 << 0x20 | uVar32 >> 0x20;
  local_68 = local_68 + uVar32;
  uVar30 = uVar30 ^ local_68;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar36 = uVar38 + lVar17 + uVar30;
  uVar32 = uVar32 ^ uVar36;
  uVar32 = uVar32 << 0x30 | uVar32 >> 0x10;
  local_68 = uVar32 + local_68;
  uVar38 = uVar31 + lVar15 + uVar37;
  uVar27 = uVar27 ^ uVar38;
  uVar31 = uVar34 << 1 | (ulong)((long)uVar34 < 0);
  uVar30 = uVar30 ^ local_68;
  uVar27 = uVar27 << 0x20 | uVar27 >> 0x20;
  local_60 = local_60 + uVar27;
  uVar37 = uVar37 ^ local_60;
  uVar37 = uVar37 << 0x28 | uVar37 >> 0x18;
  uVar38 = uVar38 + lVar8 + uVar37;
  uVar27 = uVar27 ^ uVar38;
  uVar27 = uVar27 << 0x30 | uVar27 >> 0x10;
  local_60 = local_60 + uVar27;
  uVar34 = uVar41 + lVar3 + uVar31;
  uVar27 = uVar27 ^ uVar34;
  uVar27 = uVar27 << 0x20 | uVar27 >> 0x20;
  local_68 = local_68 + uVar27;
  uVar31 = uVar31 ^ local_68;
  uVar31 = uVar31 << 0x28 | uVar31 >> 0x18;
  local_b8 = uVar34 + lVar14 + uVar31;
  uVar27 = local_b8 ^ uVar27;
  local_40 = uVar27 << 0x30 | uVar27 >> 0x10;
  local_68 = local_40 + local_68;
  uVar31 = local_68 ^ uVar31;
  uStack_90 = uVar31 << 1 | (ulong)((long)uVar31 < 0);
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar27 = uVar33 + lVar29 + uVar30;
  uVar35 = uVar35 ^ uVar27;
  uVar37 = uVar37 ^ local_60;
  uVar33 = uVar35 << 0x20 | uVar35 >> 0x20;
  local_60 = local_60 + uVar33;
  uVar30 = uVar30 ^ local_60;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uStack_b0 = uVar27 + lVar4 + uVar30;
  uVar33 = uStack_b0 ^ uVar33;
  local_58 = uVar33 << 0x30 | uVar33 >> 0x10;
  local_60 = local_58 + local_60;
  uVar30 = local_60 ^ uVar30;
  local_88 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar27 = uVar37 << 1 | (ulong)((long)uVar37 < 0);
  uVar33 = uVar36 + lVar13 + uVar27;
  uVar39 = uVar39 ^ uVar33;
  uVar30 = uVar39 << 0x20 | uVar39 >> 0x20;
  local_78 = local_78 + uVar30;
  uVar27 = uVar27 ^ local_78;
  uVar27 = uVar27 << 0x28 | uVar27 >> 0x18;
  local_a8 = uVar33 + lVar9 + uVar27;
  uVar30 = local_a8 ^ uVar30;
  local_50 = uVar30 << 0x30 | uVar30 >> 0x10;
  local_78 = local_50 + local_78;
  uVar27 = local_78 ^ uVar27;
  uStack_80 = uVar27 << 1 | (ulong)((long)uVar27 < 0);
  uVar38 = lVar7 + uVar28 + uVar38;
  uVar32 = uVar32 ^ uVar38;
  uVar32 = uVar32 << 0x20 | uVar32 >> 0x20;
  local_70 = local_70 + uVar32;
  uVar28 = uVar28 ^ local_70;
  uVar27 = uVar28 << 0x28 | uVar28 >> 0x18;
  uStack_a0 = uVar38 + lVar5 + uVar27;
  uVar32 = uStack_a0 ^ uVar32;
  local_48 = uVar32 << 0x30 | uVar32 >> 0x10;
  local_70 = local_48 + local_70;
  uVar27 = local_70 ^ uVar27;
  local_98 = uVar27 << 1 | (ulong)((long)uVar27 < 0);
  lVar29 = 0;
  do {
    puVar1 = S->h + lVar29;
    uVar18 = *(uint *)((long)puVar1 + 4);
    uVar26 = puVar1[1];
    uVar19 = *(uint *)((long)puVar1 + 0xc);
    uVar20 = *(uint *)((long)&local_b8 + lVar29 * 8 + 4);
    uVar21 = *(uint *)(&uStack_b0 + lVar29);
    uVar22 = *(uint *)((long)&uStack_b0 + lVar29 * 8 + 4);
    uVar23 = *(uint *)((long)&local_78 + lVar29 * 8 + 4);
    uVar24 = *(uint *)(&local_70 + lVar29);
    uVar25 = *(uint *)((long)&local_70 + lVar29 * 8 + 4);
    puVar2 = S->h + lVar29;
    *(uint *)puVar2 = (uint)*puVar1 ^ *(uint *)(&local_b8 + lVar29) ^ *(uint *)(&local_78 + lVar29);
    *(uint *)((long)puVar2 + 4) = uVar18 ^ uVar20 ^ uVar23;
    *(uint *)(puVar2 + 1) = (uint)uVar26 ^ uVar21 ^ uVar24;
    *(uint *)((long)puVar2 + 0xc) = uVar19 ^ uVar22 ^ uVar25;
    lVar29 = lVar29 + 2;
  } while (lVar29 != 8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void blake2b_compress( blake2b_state *S, const uint8_t block[BLAKE2B_BLOCKBYTES] )
{
  uint64_t m[16];
  uint64_t v[16];
  size_t i;

  for( i = 0; i < 16; ++i ) {
    m[i] = load64( block + i * sizeof( m[i] ) );
  }

  for( i = 0; i < 8; ++i ) {
    v[i] = S->h[i];
  }

  v[ 8] = blake2b_IV[0];
  v[ 9] = blake2b_IV[1];
  v[10] = blake2b_IV[2];
  v[11] = blake2b_IV[3];
  v[12] = blake2b_IV[4] ^ S->t[0];
  v[13] = blake2b_IV[5] ^ S->t[1];
  v[14] = blake2b_IV[6] ^ S->f[0];
  v[15] = blake2b_IV[7] ^ S->f[1];

  ROUND( 0 );
  ROUND( 1 );
  ROUND( 2 );
  ROUND( 3 );
  ROUND( 4 );
  ROUND( 5 );
  ROUND( 6 );
  ROUND( 7 );
  ROUND( 8 );
  ROUND( 9 );
  ROUND( 10 );
  ROUND( 11 );

  for( i = 0; i < 8; ++i ) {
    S->h[i] = S->h[i] ^ v[i] ^ v[i + 8];
  }
}